

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerEncode.cpp
# Opt level: O2

void DebugDer(ostream *outFile,uchar *pIn,size_t cbIn,unsigned_long level)

{
  byte bVar1;
  long lVar2;
  size_t cbIn_00;
  undefined1 uVar3;
  bool bVar4;
  ostream *poVar5;
  undefined8 *puVar6;
  long lVar7;
  ulong uVar8;
  size_t cbIn_01;
  uchar *pIn_00;
  BasicDerType local_88;
  ulong local_78;
  long local_70;
  unsigned_long local_68;
  size_t local_60;
  size_t size;
  size_t cbRead;
  uint local_48;
  DerTypeContainer type;
  
  type._4_8_ = pIn;
  if (1 < cbIn) {
    local_60 = 0;
    size = 0;
    local_68 = level + 1;
    local_70 = (long)(int)local_68;
    uVar8 = 0;
    local_78 = cbIn;
    while( true ) {
      cbIn_01 = local_78 - uVar8;
      if (local_78 < uVar8 || cbIn_01 == 0) {
        return;
      }
      bVar1 = *(byte *)(type._4_8_ + uVar8);
      cbRead._4_4_ = bVar1 & 0x1f;
      local_48 = (uint)(bVar1 >> 6);
      type.type._0_1_ = bVar1 >> 5 & Boolean;
      bVar4 = DecodeSize((byte *)(type._4_8_ + uVar8) + 1,local_78 - (uVar8 + 1),&local_60,&size);
      if (!bVar4) break;
      lVar7 = uVar8 + 1 + size;
      poVar5 = std::operator<<(outFile,0x20);
      *(long *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = local_70;
      std::operator<<(poVar5,"  ");
      uVar3 = (undefined1)type.type;
      poVar5 = operator<<(outFile,(DerTypeContainer *)((long)&cbRead + 4));
      poVar5 = std::operator<<(poVar5," 0x");
      poVar5 = std::operator<<(poVar5,0x30);
      cbIn_00 = local_60;
      lVar2 = *(long *)poVar5;
      *(undefined8 *)(poVar5 + *(long *)(lVar2 + -0x18) + 0x10) = 2;
      lVar2 = *(long *)(lVar2 + -0x18);
      *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffffb5 | 8;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      if (uVar3 == Boolean) {
        std::endl<char,std::char_traits<char>>(poVar5);
        DebugDer(outFile,(uchar *)(type._4_8_ + lVar7),cbIn_00,local_68);
      }
      else {
        pIn_00 = (uchar *)(uVar8 + type._4_8_);
        poVar5 = std::operator<<(poVar5," ");
        BasicDerType::BasicDerType(&local_88,pIn_00,cbIn_01);
        poVar5 = operator<<(poVar5,&local_88);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      uVar8 = cbIn_00 + lVar7;
    }
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = &std::cout;
  __cxa_throw(puVar6,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

void DebugDer(std::ostream& outFile, const unsigned char * pIn, size_t cbIn, unsigned long level)
{
	if (cbIn < 2)
		throw std::exception(); // Corrupt input

	size_t size = 0;
	size_t cbRead = 0;
	size_t offset = 0;

	while (offset < cbIn)
	{
		DerTypeContainer type(*(pIn + offset));
		const unsigned char* pType = pIn + offset;
		size_t cbType = cbIn - offset;

		offset += 1;
		if (!DecodeSize(pIn + offset, cbIn - offset, size, cbRead))
			throw std::exception(); // Corrupt input

		offset += cbRead;

        outFile << std::setfill(' ') << std::setw(level + 1) << "  ";

		if (type.constructed)
		{
			// It is a set, or sequence, possibly app-specific
			// Print just the type, and the size, then recurse
            outFile << type << " 0x" << std::setfill('0') << std::setw(2) << std::hex << size << std::endl;
			DebugDer(outFile, pIn + offset, size, level + 1);
		}
		else
		{
			// It is a primitive type
            outFile << type << " 0x" << std::setfill('0') << std::setw(2) << std::hex << size << " " << BasicDerType(pType, cbType) << std::endl;
		}

		// And increment to the next item
		offset += static_cast<size_t>(size);

	}

}